

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

bool __thiscall libchars::command_cursor::next(command_cursor *this)

{
  iterator *piVar1;
  ulong uVar2;
  ulong uVar3;
  command_node **ppcVar4;
  size_type sVar5;
  _Elt_pointer ppcVar6;
  bool bVar7;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined1 local_40 [8];
  string rstr;
  command_node *n;
  
  ppcVar6 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar6 ==
      (this->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    ppcVar4 = &this->root;
  }
  else {
    if (ppcVar6 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar6 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppcVar4 = ppcVar6 + -1;
  }
  rstr.field_2._8_8_ = *ppcVar4;
  if ((command_node *)rstr.field_2._8_8_ == (command_node *)0x0) {
    return false;
  }
  remainder_abi_cxx11_((command_cursor *)local_40,in_XMM0_Qa,in_XMM1_Qa);
  if (rstr._M_dataplus._M_p == (pointer)0x0) {
    ppcVar6 = (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (*(command_node **)(rstr.field_2._8_8_ + 0x38) == (command_node *)0x0) {
      if (rstr.field_2._8_8_ != 0 &&
          ppcVar6 !=
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        while (*(long *)(rstr.field_2._8_8_ + 0x48) == 0) {
          uVar2 = this->idx;
          if ((uVar2 != 0) &&
             (uVar3 = (this->w)._M_string_length, sVar5 = uVar3 - uVar2, uVar2 <= uVar3)) {
            (this->w)._M_string_length = sVar5;
            (this->w)._M_dataplus._M_p[sVar5] = '\0';
          }
          std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                    ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
                     this);
          ppcVar6 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppcVar6 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            if (this->root == (command_node *)0x0) goto LAB_0010b4db;
            uVar2 = (this->root->part)._M_string_length;
            sVar5 = 0;
            if (this->root_idx <= uVar2) {
              sVar5 = uVar2 - this->root_idx;
            }
          }
          else {
            if (ppcVar6 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar6 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            rstr.field_2._8_8_ = ppcVar6[-1];
            if ((command_node *)rstr.field_2._8_8_ == (command_node *)0x0) {
LAB_0010b4db:
              sVar5 = 0;
            }
            else {
              sVar5 = (((command_node *)rstr.field_2._8_8_)->part)._M_string_length;
            }
          }
          this->idx = sVar5;
          if (((this->S).c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
               (this->S).c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur) || (rstr.field_2._8_8_ == 0)) break;
        }
      }
      uVar2 = this->idx;
      if ((uVar2 != 0) &&
         (uVar3 = (this->w)._M_string_length, sVar5 = uVar3 - uVar2, uVar2 <= uVar3)) {
        (this->w)._M_string_length = sVar5;
        (this->w)._M_dataplus._M_p[sVar5] = '\0';
      }
      this->idx = 0;
      if (rstr.field_2._8_8_ == 0 ||
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        (this->w)._M_string_length = 0;
        *(this->w)._M_dataplus._M_p = '\0';
      }
      else {
        rstr.field_2._8_8_ = *(undefined8 *)(rstr.field_2._8_8_ + 0x48);
        std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                  ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
                   this);
        if (rstr.field_2._8_8_ != 0) {
          ppcVar6 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppcVar6 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            bVar7 = true;
            std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>::
            _M_push_back_aux<libchars::command_node*const&>
                      ((deque<libchars::command_node*,std::allocator<libchars::command_node*>> *)
                       this,(command_node **)((long)&rstr.field_2 + 8));
            goto LAB_0010b432;
          }
          *ppcVar6 = (command_node *)rstr.field_2._8_8_;
          piVar1 = &(this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
          goto LAB_0010b42f;
        }
      }
      bVar7 = false;
      goto LAB_0010b432;
    }
    if (ppcVar6 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>::
      _M_push_back_aux<libchars::command_node*const&>
                ((deque<libchars::command_node*,std::allocator<libchars::command_node*>> *)this,
                 (command_node **)(rstr.field_2._8_8_ + 0x38));
    }
    else {
      *ppcVar6 = *(command_node **)(rstr.field_2._8_8_ + 0x38);
      piVar1 = &(this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    this->idx = 0;
  }
  else {
    std::__cxx11::string::_M_append((char *)&this->w,(ulong)local_40);
    this->idx = (size_t)(rstr._M_dataplus._M_p + this->idx);
  }
LAB_0010b42f:
  bVar7 = true;
LAB_0010b432:
  if (local_40 != (undefined1  [8])&rstr._M_string_length) {
    operator_delete((void *)local_40,rstr._M_string_length + 1);
  }
  return bVar7;
}

Assistant:

bool command_cursor::next()
    {
        // depth first search
        command_node *n = current();
        if (n == NULL)
            return false;

        /*
        if (S.empty())
            LC_LOG_VERBOSE("root[%p]@%zu; w[%s]",root,idx,w.c_str());
        else
            LC_LOG_VERBOSE("n[%p]@%zu; w[%s]",n,idx,w.c_str());
        */

        std::string rstr = remainder();
        if (!rstr.empty()) {
            //LC_LOG_VERBOSE("w + [%s]",rstr.c_str());
            w.append(rstr);
            idx += rstr.length();
            return true;
        }
        else if (n->head != NULL) {
            //LC_LOG_VERBOSE("push[%p;next=%p]",n->head,n->head->next);
            S.push(n->head);
            idx = 0;
            return true;
        }
        else {
            while (!S.empty() && n != NULL && n->next == NULL) {
                if (idx > 0 && idx <= w.length())
                    w.erase(w.length() - idx);

                //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
                S.pop();

                if (S.empty()) {
                    if (root != NULL && root_idx < root->part.length())
                        idx = root->part.length() - root_idx;
                    else
                        idx = 0;
                }
                else {
                    if ((n = S.top()) != NULL)
                        idx = n->part.length();
                    else
                        idx = 0;
                }
            }

            if (idx > 0 && idx <= w.length())
                w.erase(w.length() - idx);

            idx = 0;
            if (S.empty() || n == NULL) {
                w.clear();
                return false;
            }

            n = n->next;
            //LC_LOG_VERBOSE("pop[%p;next=%p]",S.top(),S.top()->next);
            S.pop();

            if (n != NULL) {
                //LC_LOG_VERBOSE("push[%p;next=%p]",n,n->next);
                S.push(n);
                return true;
            }
        }
        return false;
    }